

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateDatatypeValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DateDatatypeValidator::getCanonicalRepresentation
          (DateDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  XMLCh *pXVar1;
  MemoryManager *local_c8;
  undefined1 local_b8 [8];
  XMLDateTime aDateTime;
  DateDatatypeValidator *temp;
  MemoryManager *toUse;
  bool toValidate_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  DateDatatypeValidator *this_local;
  
  local_c8 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_c8 = (this->super_DateTimeValidator).super_AbstractNumericFacetValidator.
               super_DatatypeValidator.fMemoryManager;
  }
  if (toValidate) {
    (*(this->super_DateTimeValidator).super_AbstractNumericFacetValidator.super_DatatypeValidator.
      super_XSerializable._vptr_XSerializable[0x11])(this,rawData,0,0,local_c8);
  }
  XMLDateTime::XMLDateTime((XMLDateTime *)local_b8,rawData,local_c8);
  XMLDateTime::parseDate((XMLDateTime *)local_b8);
  pXVar1 = XMLDateTime::getDateCanonicalRepresentation((XMLDateTime *)local_b8,local_c8);
  XMLDateTime::~XMLDateTime((XMLDateTime *)local_b8);
  return pXVar1;
}

Assistant:

const XMLCh* DateDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                              ,      MemoryManager* const memMgr
                                                              ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;

    if (toValidate)
    {
        DateDatatypeValidator* temp = (DateDatatypeValidator*) this;

        try
        {
            temp->checkContent(rawData, 0, false, toUse);   
        }
        catch (...)
        {
            return 0;
        }
    }
    
    try
    {
        XMLDateTime aDateTime(rawData, toUse);
        aDateTime.parseDate();
        return aDateTime.getDateCanonicalRepresentation(toUse);
    }
    catch (...)
    {
        return 0;
    }

}